

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionStamp.hpp
# Opt level: O0

void __thiscall
OpenMD::InversionStamp::setSatellites(InversionStamp *this,vector<int,_std::allocator<int>_> *sats)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *this_00;
  string *msg;
  undefined8 uVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  ostringstream oss;
  size_type in_stack_fffffffffffffe08;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe10;
  ostringstream *this_01;
  value_type_conflict2 *in_stack_fffffffffffffe18;
  OpenMDException *in_stack_fffffffffffffe20;
  ostringstream local_188 [392];
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar1 == 3) {
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
    std::vector<int,_std::allocator<int>_>::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_fffffffffffffe18);
    std::vector<int,_std::allocator<int>_>::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_fffffffffffffe18);
    std::vector<int,_std::allocator<int>_>::at(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_fffffffffffffe18);
    return;
  }
  this_01 = local_188;
  std::__cxx11::ostringstream::ostringstream(this_01);
  msg = (string *)
        std::operator<<((ostream *)this_01,"Incorrect number of satellites to add to inversion!");
  std::ostream::operator<<(msg,std::endl<char,std::char_traits<char>>);
  uVar2 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(in_stack_fffffffffffffe20,msg);
  __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setSatellites(const std::vector<int>& sats) {
      if (sats.size() == 3) {
        satellites_.push_back(sats.at(0));
        satellites_.push_back(sats.at(1));
        satellites_.push_back(sats.at(2));
      } else {
        std::ostringstream oss;
        oss << "Incorrect number of satellites to add to inversion!"
            << std::endl;
        throw OpenMDException(oss.str());
      }
    }